

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O1

bool __thiscall QPathEdit::setPath(QPathEdit *this,QString *path,bool allowInvalid)

{
  long lVar1;
  int iVar2;
  QString *pQVar3;
  bool bVar4;
  bool bVar5;
  QStringView QVar6;
  QStringView QVar7;
  int pseudo;
  QString local_78;
  QArrayData *local_60;
  storage_type_conflict *local_58;
  long local_50;
  QArrayData *local_48;
  char16_t *local_40;
  undefined8 local_38;
  undefined4 local_2c;
  
  QLineEdit::text();
  lVar1 = (path->d).size;
  if (local_50 == lVar1) {
    QVar6.m_data = local_58;
    QVar6.m_size = local_50;
    QVar7.m_data = (path->d).ptr;
    QVar7.m_size = lVar1;
    iVar2 = QtPrivate::compareStrings(QVar6,QVar7,CaseSensitive);
    bVar4 = iVar2 == 0;
  }
  else {
    bVar4 = false;
  }
  if (local_60 != (QArrayData *)0x0) {
    LOCK();
    (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60,2,8);
    }
  }
  bVar5 = true;
  if (!bVar4) {
    if (allowInvalid) {
      QLineEdit::setText((QString *)this->edit);
    }
    local_2c = 0;
    iVar2 = (**(code **)(*(long *)this->pathValidator + 0x60))(this->pathValidator,path);
    bVar5 = iVar2 == 2;
    if (bVar5) {
      local_60 = (QArrayData *)0x0;
      local_58 = L"\\";
      local_50 = 1;
      local_48 = (QArrayData *)0x0;
      local_40 = L"/";
      local_38 = 1;
      pQVar3 = (QString *)
               QString::replace((QString *)path,(QString *)&local_60,(CaseSensitivity)&local_48);
      QString::operator=(&this->currentValidPath,pQVar3);
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,8);
        }
      }
      if (local_60 != (QArrayData *)0x0) {
        LOCK();
        (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_60,2,8);
        }
      }
      if (!allowInvalid) {
        QLineEdit::setText((QString *)this->edit);
      }
      local_78.d.d = (path->d).d;
      local_78.d.ptr = (path->d).ptr;
      local_78.d.size = (path->d).size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pathChanged(this,&local_78);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool QPathEdit::setPath(QString path, bool allowInvalid) {
    if (edit->text() == path) {
		return true;
    }

    if(allowInvalid) {
		edit->setText(path);
    }

	int pseudo = 0;
	if(pathValidator->validate(path, pseudo) == QValidator::Acceptable) {
		currentValidPath = path.replace(QStringLiteral("\\"), QStringLiteral("/"));
        if(!allowInvalid) {
			edit->setText(path);
        }
		emit pathChanged(path);
		return true;
    } else {
		return false;
    }
}